

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

BrotliDecoderResult
BrotliDecoderDecompress
          (size_t encoded_size,uint8_t *encoded_buffer,size_t *decoded_size,uint8_t *decoded_buffer,
          int save_info_for_recompression,BackwardReferenceFromDecoder **backward_references,
          size_t *backward_references_size,BlockSplitFromDecoder *literals_block_splits,
          BlockSplitFromDecoder *insert_copy_length_block_splits)

{
  int iVar1;
  uint8_t *local_1530;
  uint8_t *next_out;
  size_t available_out;
  uint8_t *next_in;
  size_t available_in;
  size_t total_out;
  undefined1 local_1500 [4];
  BrotliDecoderResult result;
  BrotliDecoderStateInternal s;
  BackwardReferenceFromDecoder **backward_references_local;
  int save_info_for_recompression_local;
  uint8_t *decoded_buffer_local;
  size_t *decoded_size_local;
  uint8_t *encoded_buffer_local;
  size_t encoded_size_local;
  
  available_in = 0;
  next_out = (uint8_t *)*decoded_size;
  s.substate_decode_uint8._0_2_ =
       (undefined2)s.substate_decode_uint8 & 0xffbf | ((ushort)save_info_for_recompression & 1) << 6
  ;
  local_1530 = decoded_buffer;
  available_out = (size_t)encoded_buffer;
  next_in = (uint8_t *)encoded_size;
  s.arena._4400_8_ = backward_references;
  iVar1 = BrotliDecoderStateInit
                    ((BrotliDecoderStateInternal *)local_1500,(brotli_alloc_func)0x0,
                     (brotli_free_func)0x0,(void *)0x0);
  if (iVar1 == 0) {
    encoded_size_local._4_4_ = BROTLI_DECODER_RESULT_ERROR;
  }
  else {
    total_out._4_4_ =
         BrotliDecoderDecompressStream
                   ((BrotliDecoderStateInternal *)local_1500,(size_t *)&next_in,
                    (uint8_t **)&available_out,(size_t *)&next_out,&local_1530,&available_in);
    *decoded_size = available_in;
    BrotliDecoderStateCleanup((BrotliDecoderStateInternal *)local_1500);
    if (total_out._4_4_ != BROTLI_DECODER_RESULT_SUCCESS) {
      total_out._4_4_ = BROTLI_DECODER_RESULT_ERROR;
    }
    if (((ushort)(undefined2)s.substate_decode_uint8 >> 6 & 1) != 0) {
      *(void **)s.arena._4400_8_ = s.memory_manager_opaque;
      *backward_references_size = (size_t)s.commands;
      memcpy(literals_block_splits,&s.commands_size,0x40);
      memcpy(insert_copy_length_block_splits,&s.saved_position_literals_begin,0x40);
    }
    encoded_size_local._4_4_ = total_out._4_4_;
  }
  return encoded_size_local._4_4_;
}

Assistant:

BrotliDecoderResult BrotliDecoderDecompress(
    size_t encoded_size, const uint8_t* encoded_buffer, size_t* decoded_size,
    uint8_t* decoded_buffer, BROTLI_BOOL save_info_for_recompression,
    BackwardReferenceFromDecoder** backward_references,
    size_t* backward_references_size,
    BlockSplitFromDecoder* literals_block_splits,
    BlockSplitFromDecoder* insert_copy_length_block_splits) {
  BrotliDecoderState s;
  BrotliDecoderResult result;
  size_t total_out = 0;
  size_t available_in = encoded_size;
  const uint8_t* next_in = encoded_buffer;
  size_t available_out = *decoded_size;
  uint8_t* next_out = decoded_buffer;
  s.save_info_for_recompression = save_info_for_recompression;

  if (!BrotliDecoderStateInit(&s, 0, 0, 0)) {
    return BROTLI_DECODER_RESULT_ERROR;
  }
  result = BrotliDecoderDecompressStream(
      &s, &available_in, &next_in, &available_out, &next_out, &total_out);
  *decoded_size = total_out;
  BrotliDecoderStateCleanup(&s);
  if (result != BROTLI_DECODER_RESULT_SUCCESS) {
    result = BROTLI_DECODER_RESULT_ERROR;
  }
  if (s.save_info_for_recompression) {
    *backward_references = s.commands;
    *backward_references_size = s.commands_size;
    *literals_block_splits = s.literals_block_splits;
    *insert_copy_length_block_splits = s.insert_copy_length_block_splits;
  }


  return result;
}